

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR lyxp_expr_parse(ly_ctx *ctx,char *expr_str,size_t expr_len,ly_bool reparse,lyxp_expr **expr_p
                      )

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  LY_ERR LVar5;
  int iVar6;
  uint uVar7;
  LY_ERR LVar8;
  lyxp_expr *exp;
  lyxp_token *plVar9;
  uint32_t *puVar10;
  ushort **ppuVar11;
  ssize_t sVar12;
  lyxp_expr_type **pplVar13;
  undefined7 in_register_00000009;
  lyxp_token token;
  size_t __n;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  char *__s2;
  char *pcVar17;
  undefined8 uVar18;
  long lVar19;
  size_t str_len;
  bool bVar20;
  uint32_t tok_idx;
  undefined8 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  uint32_t local_38;
  undefined4 local_34;
  
  local_38 = 0;
  if (expr_p == (lyxp_expr **)0x0) {
    __assert_fail("expr_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0xb52,
                  "LY_ERR lyxp_expr_parse(const struct ly_ctx *, const char *, size_t, ly_bool, struct lyxp_expr **)"
                 );
  }
  if (*expr_str == '\0') {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
    return LY_EVALID;
  }
  if (expr_len == 0) {
    expr_len = strlen(expr_str);
  }
  if (expr_len >> 0x20 != 0) {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"XPath expression cannot be longer than %u characters.",
            0xffffffff);
    return LY_EVALID;
  }
  exp = (lyxp_expr *)calloc(1,0x30);
  if (exp != (lyxp_expr *)0x0) {
    local_34 = (undefined4)CONCAT71(in_register_00000009,reparse);
    LVar5 = lydict_insert(ctx,expr_str,expr_len,&exp->expr);
    if (LVar5 != LY_SUCCESS) goto LAB_001a3425;
    exp->used = 0;
    exp->size = 10;
    plVar9 = (lyxp_token *)malloc(0x28);
    exp->tokens = plVar9;
    if (plVar9 != (lyxp_token *)0x0) {
      puVar10 = (uint32_t *)malloc(0x28);
      exp->tok_pos = puVar10;
      if (puVar10 != (uint32_t *)0x0) {
        puVar10 = (uint32_t *)malloc(0x28);
        exp->tok_len = puVar10;
        if (puVar10 != (uint32_t *)0x0) {
          pcVar2 = exp->expr;
          lVar19 = 0;
          while ((uVar16 = (ulong)(byte)pcVar2[lVar19], uVar16 < 0x21 &&
                 ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0))) {
            lVar19 = lVar19 + 1;
          }
          bVar3 = false;
          bVar20 = false;
          do {
            pcVar17 = pcVar2 + lVar19;
            cVar14 = (char)uVar16;
            uVar15 = (uint)uVar16;
            if (0x3f < uVar15) {
              if (uVar15 == 0x40) {
                token = LYXP_TOKEN_AT;
              }
              else if (uVar15 == 0x5b) {
                token = LYXP_TOKEN_BRACK1;
              }
              else {
                if (uVar15 != 0x5d) goto switchD_001a347a_caseD_23;
                token = LYXP_TOKEN_BRACK2;
              }
              goto LAB_001a38b7;
            }
            switch(uVar15) {
            case 0x22:
              str_len = 2;
              do {
                if (pcVar17[str_len - 1] == '\0') {
                  uVar18 = 0x22;
LAB_001a3b3f:
                  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                          "Unterminated string delimited with %c (%.15s).",uVar18);
                  goto LAB_001a3b46;
                }
                if (pcVar17[str_len - 1] == '\"') goto LAB_001a358a;
                str_len = str_len + 1;
              } while( true );
            default:
switchD_001a347a_caseD_23:
              ppuVar11 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar11 + (long)cVar14 * 2 + 1) & 8) == 0) {
                if (0x2e < uVar15) {
                  if (uVar15 < 0x3d) {
                    if (uVar15 == 0x2f) {
                      str_len = (ulong)(pcVar17[1] == '/') + 1;
                      token = pcVar17[1] == '/' | LYXP_TOKEN_OPER_PATH;
                      break;
                    }
                    if (uVar15 != 0x3c) goto LAB_001a37ac;
LAB_001a3701:
                    if (pcVar17[1] == '=') {
                      token = LYXP_TOKEN_OPER_COMP;
                      goto LAB_001a35a0;
                    }
                    token = LYXP_TOKEN_OPER_COMP;
                  }
                  else if (uVar15 == 0x3d) {
                    token = LYXP_TOKEN_OPER_EQUAL;
                  }
                  else {
                    if (uVar15 == 0x3e) goto LAB_001a3701;
                    if (uVar15 != 0x7c) goto LAB_001a37ac;
                    token = LYXP_TOKEN_OPER_UNI;
                  }
                  goto LAB_001a38b7;
                }
                if (0x2a < uVar15) {
                  if ((uVar15 != 0x2b) && (uVar15 != 0x2d)) goto LAB_001a37ac;
LAB_001a36e3:
                  token = LYXP_TOKEN_OPER_MATH;
                  goto LAB_001a38b7;
                }
                if (uVar15 == 0x21) {
                  if (pcVar17[1] == '=') {
                    token = LYXP_TOKEN_OPER_NEQUAL;
                    goto LAB_001a35a0;
                  }
LAB_001a37ac:
                  if (exp->used == 0) {
LAB_001a37dc:
                    str_len = 1;
                    if ((cVar14 != '*') &&
                       (str_len = parse_ncname(in_stack_ffffffffffffff90), (long)str_len < 1))
                    goto LAB_001a3b5e;
                    lVar1 = lVar19 + str_len;
                    bVar4 = 1;
                    if ((pcVar2[lVar1] == ':') && (pcVar2[lVar1 + 1] == ':')) {
                      LVar5 = expr_parse_axis(pcVar17,str_len);
                      if (LVar5 != LY_SUCCESS) goto LAB_001a3b61;
                      LVar5 = exp_add_token(ctx,exp,LYXP_TOKEN_AXISNAME,(uint32_t)lVar19,
                                            (uint32_t)str_len);
                      if ((LVar5 != LY_SUCCESS) ||
                         (LVar5 = exp_add_token(ctx,exp,LYXP_TOKEN_DCOLON,(uint32_t)lVar1,2),
                         LVar5 != LY_SUCCESS)) goto LAB_001a3425;
                      lVar19 = lVar1 + 2;
                      if (pcVar2[lVar1 + 2] == '*') {
                        str_len = 1;
                      }
                      else {
                        str_len = parse_ncname(in_stack_ffffffffffffff90);
                        if ((long)str_len < 1) goto LAB_001a3b5e;
                      }
                      bVar4 = 0;
                    }
                    pcVar17 = pcVar2 + lVar19;
                    if (pcVar17[str_len] == ':') {
                      if (pcVar17[str_len + 1] == '*') {
                        str_len = str_len + 2;
                      }
                      else {
                        sVar12 = parse_ncname(in_stack_ffffffffffffff90);
                        if (sVar12 < 1) {
                          lVar19 = lVar19 - sVar12;
                          goto LAB_001a3b61;
                        }
                        str_len = str_len + 1 + sVar12;
                      }
                      token = LYXP_TOKEN_NAMETEST;
                      goto LAB_001a3983;
                    }
                    bVar20 = *pcVar17 != '*';
                    bVar3 = (bool)(bVar4 & bVar20);
                    token = LYXP_TOKEN_NAMETEST;
                    break;
                  }
                  uVar7 = exp->used - 1;
                  if ((exp->tokens[uVar7] < LYXP_TOKEN_AXISNAME) &&
                     ((0x3fc18aU >> (exp->tokens[uVar7] & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) !=
                      0)) goto LAB_001a37dc;
                  if (uVar15 < 100) {
                    if (uVar15 == 0x2a) goto LAB_001a36e3;
                    if (((uVar15 != 0x61) || (pcVar17[1] != 'n')) || (pcVar17[2] != 'd'))
                    goto LAB_001a3bd2;
                    token = LYXP_TOKEN_OPER_LOG;
LAB_001a3a4c:
                    str_len = 3;
                    break;
                  }
                  if (uVar15 == 100) {
                    if ((pcVar17[1] == 'i') && (pcVar17[2] == 'v')) {
LAB_001a3a47:
                      token = LYXP_TOKEN_OPER_MATH;
                      goto LAB_001a3a4c;
                    }
                  }
                  else if (uVar15 == 0x6d) {
                    if ((pcVar17[1] == 'o') && (pcVar17[2] == 'd')) goto LAB_001a3a47;
                  }
                  else if ((uVar15 == 0x6f) && (pcVar17[1] == 'r')) {
                    token = LYXP_TOKEN_OPER_LOG;
                    goto LAB_001a35a0;
                  }
LAB_001a3bd2:
                  uVar16 = (ulong)(uint)(int)cVar14;
                  if (bVar20 || bVar3) {
                    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                            "Invalid character 0x%x (\'%c\'), perhaps \"%.*s\" is supposed to be a function call."
                            ,uVar16,(ulong)(uint)(int)cVar14,
                            CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                     exp->tok_len[uVar7]),exp->expr + exp->tok_pos[uVar7]);
                    LVar5 = LY_EVALID;
                    goto LAB_001a3425;
                  }
LAB_001a3b66:
                  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                          "Invalid character \'%c\'[%u] of expression \'%s\'.",uVar16,
                          (ulong)((int)lVar19 + 1),pcVar2);
                }
                else {
                  if (uVar15 != 0x24) goto LAB_001a37ac;
                  lVar1 = lVar19 + 1;
                  lVar19 = lVar19 + 1;
                  str_len = parse_ncname(in_stack_ffffffffffffff90);
                  if ((long)str_len < 1) {
LAB_001a3b5e:
                    lVar19 = lVar19 - str_len;
LAB_001a3b61:
                    uVar16 = (ulong)(uint)(int)pcVar2[lVar19];
                    goto LAB_001a3b66;
                  }
                  token = LYXP_TOKEN_VARREF;
                  if (pcVar2[str_len + lVar1] != ':') break;
                  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Variable with prefix is not supported.");
                }
LAB_001a3b46:
                LVar5 = LY_EVALID;
                goto LAB_001a3425;
              }
LAB_001a3643:
              str_len = 0xffffffffffffffff;
              do {
                lVar1 = str_len + 1;
                str_len = str_len + 1;
              } while ((*(byte *)((long)*ppuVar11 + (long)pcVar17[lVar1] * 2 + 1) & 8) != 0);
              token = LYXP_TOKEN_NUMBER;
              if (pcVar17[lVar1] == '.') {
                do {
                  lVar1 = str_len + 1;
                  str_len = str_len + 1;
                } while ((*(byte *)((long)*ppuVar11 + (long)pcVar17[lVar1] * 2 + 1) & 8) != 0);
              }
              break;
            case 0x27:
              str_len = 2;
              while( true ) {
                if (pcVar17[str_len - 1] == '\0') {
                  uVar18 = 0x27;
                  goto LAB_001a3b3f;
                }
                if (pcVar17[str_len - 1] == '\'') break;
                str_len = str_len + 1;
              }
LAB_001a358a:
              token = LYXP_TOKEN_LITERAL;
              break;
            case 0x28:
              if ((bVar20) && (exp->used != 0)) {
                plVar9 = exp->tokens;
                uVar15 = exp->used - 1;
                if (plVar9[uVar15] != LYXP_TOKEN_NAMETEST) goto LAB_001a3739;
                if (exp->tok_len[uVar15] == 7) {
                  pcVar17 = pcVar2 + exp->tok_pos[uVar15];
                  __n = 7;
                  __s2 = "comment";
LAB_001a3730:
                  iVar6 = strncmp(pcVar17,__s2,__n);
                  if (iVar6 != 0) goto LAB_001a3739;
                }
                else {
                  if (exp->tok_len[uVar15] != 4) goto LAB_001a3739;
                  pcVar17 = pcVar2 + exp->tok_pos[uVar15];
                  iVar6 = strncmp(pcVar17,"node",4);
                  if (iVar6 != 0) {
                    __n = 4;
                    __s2 = "text";
                    goto LAB_001a3730;
                  }
                }
                plVar9[uVar15] = LYXP_TOKEN_NODETYPE;
                token = LYXP_TOKEN_PAR1;
                str_len = 1;
LAB_001a3983:
                bVar3 = false;
                bVar20 = false;
              }
              else {
LAB_001a3739:
                token = LYXP_TOKEN_PAR1;
                str_len = 1;
                if (bVar3) {
                  if (exp->used != 0) {
                    uVar15 = exp->used - 1;
                    if (exp->tokens[uVar15] == LYXP_TOKEN_NAMETEST) {
                      exp->tokens[uVar15] = LYXP_TOKEN_FUNCNAME;
                      goto LAB_001a3983;
                    }
                  }
                }
                else {
                  bVar3 = false;
                }
              }
              break;
            case 0x29:
              token = LYXP_TOKEN_PAR2;
              goto LAB_001a38b7;
            case 0x2c:
              token = LYXP_TOKEN_COMMA;
LAB_001a38b7:
              str_len = 1;
              break;
            case 0x2e:
              if (pcVar17[1] != '.') {
                ppuVar11 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar11 + (long)pcVar17[1] * 2 + 1) & 8) != 0)
                goto LAB_001a3643;
                token = LYXP_TOKEN_DOT;
                goto LAB_001a38b7;
              }
              token = LYXP_TOKEN_DDOT;
LAB_001a35a0:
              str_len = 2;
            }
            LVar5 = exp_add_token(ctx,exp,token,(uint32_t)lVar19,(uint32_t)str_len);
            if (LVar5 != LY_SUCCESS) goto LAB_001a3425;
            for (lVar19 = lVar19 + str_len; uVar16 = (ulong)(byte)pcVar2[lVar19], uVar16 < 0x21;
                lVar19 = lVar19 + 1) {
              if ((0x100002600U >> (uVar16 & 0x3f) & 1) == 0) {
                if (uVar16 == 0) {
                  if ((char)local_34 != '\0') {
                    pplVar13 = (lyxp_expr_type **)calloc((ulong)exp->size,8);
                    exp->repeat = pplVar13;
                    if (pplVar13 == (lyxp_expr_type **)0x0) goto LAB_001a3414;
                    LVar8 = reparse_or_expr(ctx,exp,&local_38,0);
                    LVar5 = LY_EVALID;
                    if (LVar8 != LY_SUCCESS) goto LAB_001a3425;
                    if (local_38 < exp->used) {
                      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                              "Unparsed characters \"%s\" left at the end of an XPath expression.",
                              exp->expr + exp->tok_pos[local_38]);
                      goto LAB_001a3425;
                    }
                  }
                  print_expr_struct_debug(exp);
                  *expr_p = exp;
                  return LY_SUCCESS;
                }
                break;
              }
            }
          } while( true );
        }
      }
    }
  }
LAB_001a3414:
  LVar5 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_expr_parse");
LAB_001a3425:
  lyxp_expr_free(ctx,exp);
  return LVar5;
}

Assistant:

LY_ERR
lyxp_expr_parse(const struct ly_ctx *ctx, const char *expr_str, size_t expr_len, ly_bool reparse, struct lyxp_expr **expr_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr;
    size_t parsed = 0, tok_len;
    enum lyxp_token tok_type;
    ly_bool prev_func_check = 0, prev_ntype_check = 0, has_axis;
    uint32_t tok_idx = 0;
    ssize_t ncname_len;

    assert(expr_p);

    if (!expr_str[0]) {
        LOGVAL(ctx, LY_VCODE_XP_EOF);
        return LY_EVALID;
    }

    if (!expr_len) {
        expr_len = strlen(expr_str);
    }
    if (expr_len > UINT32_MAX) {
        LOGVAL(ctx, LYVE_XPATH, "XPath expression cannot be longer than %" PRIu32 " characters.", UINT32_MAX);
        return LY_EVALID;
    }

    /* init lyxp_expr structure */
    expr = calloc(1, sizeof *expr);
    LY_CHECK_ERR_GOTO(!expr, LOGMEM(ctx); ret = LY_EMEM, error);
    LY_CHECK_GOTO(ret = lydict_insert(ctx, expr_str, expr_len, &expr->expr), error);
    expr->used = 0;
    expr->size = LYXP_EXPR_SIZE_START;
    expr->tokens = malloc(expr->size * sizeof *expr->tokens);
    LY_CHECK_ERR_GOTO(!expr->tokens, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_pos = malloc(expr->size * sizeof *expr->tok_pos);
    LY_CHECK_ERR_GOTO(!expr->tok_pos, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_len = malloc(expr->size * sizeof *expr->tok_len);
    LY_CHECK_ERR_GOTO(!expr->tok_len, LOGMEM(ctx); ret = LY_EMEM, error);

    /* make expr 0-terminated */
    expr_str = expr->expr;

    while (is_xmlws(expr_str[parsed])) {
        ++parsed;
    }

    do {
        if (expr_str[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_ntype_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST) &&
                    (((expr->tok_len[expr->used - 1] == 4) &&
                    (!strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "node", 4) ||
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "text", 4))) ||
                    ((expr->tok_len[expr->used - 1] == 7) &&
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "comment", 7)))) {
                /* it is NodeType after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_NODETYPE;

                prev_ntype_check = 0;
                prev_func_check = 0;
            } else if (prev_func_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is FunctionName after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_FUNCNAME;

                prev_ntype_check = 0;
                prev_func_check = 0;
            }

        } else if (expr_str[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr_str[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr_str[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr_str[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr_str[parsed] == '.') && (!isdigit(expr_str[parsed + 1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr_str[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr_str[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr_str[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\''); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr_str[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\"'); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr_str[parsed] == '.') || (isdigit(expr_str[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            if (expr_str[parsed + tok_len] == '.') {
                ++tok_len;
                for ( ; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr_str[parsed] == '$') {

            /* VariableReference */
            parsed++;
            ncname_len = parse_ncname(&expr_str[parsed]);
            LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                    (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            tok_len = ncname_len;
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == ':',
                    LOGVAL(ctx, LYVE_XPATH, "Variable with prefix is not supported."); ret = LY_EVALID,
                    error);
            tok_type = LYXP_TOKEN_VARREF;

        } else if (expr_str[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr_str[parsed], "//", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_RPATH;
            } else {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_PATH;
            }

        } else if (!strncmp(&expr_str[parsed], "!=", 2)) {

            /* Operator '!=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_NEQUAL;

        } else if (!strncmp(&expr_str[parsed], "<=", 2) || !strncmp(&expr_str[parsed], ">=", 2)) {

            /* Operator '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr_str[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_UNI;

        } else if ((expr_str[parsed] == '+') || (expr_str[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_MATH;

        } else if (expr_str[parsed] == '=') {

            /* Operator '=' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_EQUAL;

        } else if ((expr_str[parsed] == '<') || (expr_str[parsed] == '>')) {

            /* Operator '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr->used && (expr->tokens[expr->used - 1] != LYXP_TOKEN_AT) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_PAR1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_BRACK1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_COMMA) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_LOG) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_EQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_NEQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_COMP) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_MATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_UNI) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_PATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_RPATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr_str[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (!strncmp(&expr_str[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "mod", 3) || !strncmp(&expr_str[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (prev_ntype_check || prev_func_check) {
                LOGVAL(ctx, LYVE_XPATH,
                        "Invalid character 0x%x ('%c'), perhaps \"%.*s\" is supposed to be a function call.",
                        expr_str[parsed], expr_str[parsed], (int)expr->tok_len[expr->used - 1],
                        &expr->expr[expr->tok_pos[expr->used - 1]]);
                ret = LY_EVALID;
                goto error;
            } else {
                LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str);
                ret = LY_EVALID;
                goto error;
            }
        } else {

            /* (AxisName '::')? ((NCName ':')? '*' | QName) or NodeType/FunctionName */
            if (expr_str[parsed] == '*') {
                ncname_len = 1;
            } else {
                ncname_len = parse_ncname(&expr_str[parsed]);
                LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                        (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            }
            tok_len = ncname_len;

            has_axis = 0;
            if (!strncmp(&expr_str[parsed + tok_len], "::", 2)) {
                /* axis */
                LY_CHECK_ERR_GOTO(expr_parse_axis(&expr_str[parsed], ncname_len),
                        LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str); ret = LY_EVALID,
                        error);
                tok_type = LYXP_TOKEN_AXISNAME;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                /* '::' */
                tok_len = 2;
                tok_type = LYXP_TOKEN_DCOLON;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                if (expr_str[parsed] == '*') {
                    ncname_len = 1;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                }
                tok_len = ncname_len;

                has_axis = 1;
            }

            if (expr_str[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr_str[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed + tok_len]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                    tok_len += ncname_len;
                }
                /* remove old flags to prevent ambiguities */
                prev_ntype_check = 0;
                prev_func_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* if not '*', there is no prefix so it can still be NodeType/FunctionName, we can't finally decide now */
                prev_ntype_check = (expr_str[parsed] == '*') ? 0 : 1;
                prev_func_check = (prev_ntype_check && !has_axis) ? 1 : 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
        parsed += tok_len;
        while (is_xmlws(expr_str[parsed])) {
            ++parsed;
        }

    } while (expr_str[parsed]);

    if (reparse) {
        /* prealloc repeat */
        expr->repeat = calloc(expr->size, sizeof *expr->repeat);
        LY_CHECK_ERR_GOTO(!expr->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

        /* fill repeat */
        LY_CHECK_ERR_GOTO(reparse_or_expr(ctx, expr, &tok_idx, 0), ret = LY_EVALID, error);
        if (expr->used > tok_idx) {
            LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of an XPath expression.",
                    &expr->expr[expr->tok_pos[tok_idx]]);
            ret = LY_EVALID;
            goto error;
        }
    }

    print_expr_struct_debug(expr);
    *expr_p = expr;
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, expr);
    return ret;
}